

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult *
iuutil::CmpHelperSTRLNEQ
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,size_t len1,char *val2)

{
  AssertionResult *pAVar1;
  AssertionResult local_60;
  char *local_38;
  size_t len2;
  char *val2_local;
  size_t len1_local;
  char *expr2_local;
  char *expr1_local;
  
  len2 = (size_t)val2;
  val2_local = (char *)len1;
  len1_local = (size_t)expr2;
  expr2_local = expr1;
  expr1_local = (char *)__return_storage_ptr__;
  local_38 = (char *)strlen(val2);
  if (local_38 == val2_local) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar1 = iutest::AssertionResult::operator<<(&local_60,(char (*) [18])"error: Value of: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" == strlen(");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&len1_local);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [2])0x551ef7);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])0x544e98);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&len2);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [4])0x544e77);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(unsigned_long *)&local_38);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\nExpected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(unsigned_long *)&val2_local);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    iutest::AssertionResult::~AssertionResult(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const char* val2)
{
    const size_t len2 = strlen(val2);
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}